

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

bool cmsys::SystemTools::FilesDiffer(string *source,string *destination)

{
  byte bVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  size_t local_2580;
  streamsize nnext;
  char dest_buf [4096];
  char source_buf [4096];
  long local_558;
  ifstream finDestination;
  long local_350;
  ifstream finSource;
  size_t local_148;
  off_t nleft;
  stat statDestination;
  stat statSource;
  string *destination_local;
  string *source_local;
  
  pcVar3 = (char *)std::__cxx11::string::c_str();
  iVar2 = stat(pcVar3,(stat *)(statDestination.__glibc_reserved + 2));
  if (iVar2 == 0) {
    pcVar3 = (char *)std::__cxx11::string::c_str();
    iVar2 = stat(pcVar3,(stat *)&nleft);
    if (iVar2 == 0) {
      if (statSource.st_rdev == statDestination.st_rdev) {
        if (statSource.st_rdev == 0) {
          source_local._7_1_ = false;
        }
        else {
          local_148 = statSource.st_rdev;
          pcVar3 = (char *)std::__cxx11::string::c_str();
          std::ifstream::ifstream(&local_350,pcVar3,_S_in);
          pcVar3 = (char *)std::__cxx11::string::c_str();
          std::ifstream::ifstream(&local_558,pcVar3,_S_in);
          bVar1 = std::ios::operator!((ios *)((long)&local_350 + *(long *)(local_350 + -0x18)));
          if (((bVar1 & 1) == 0) &&
             (bVar1 = std::ios::operator!((ios *)((long)&local_558 + *(long *)(local_558 + -0x18))),
             (bVar1 & 1) == 0)) {
            for (; 0 < (long)local_148; local_148 = local_148 - local_2580) {
              if ((long)local_148 < 0x1001) {
                local_2580 = local_148;
              }
              else {
                local_2580 = 0x1000;
              }
              std::istream::read((char *)&local_350,(long)(dest_buf + 0xff8));
              std::istream::read((char *)&local_558,(long)&nnext);
              sVar4 = std::istream::gcount();
              if ((sVar4 != local_2580) || (sVar4 = std::istream::gcount(), sVar4 != local_2580)) {
                source_local._7_1_ = true;
                goto LAB_0062b43b;
              }
              iVar2 = memcmp(dest_buf + 0xff8,&nnext,local_2580);
              if (iVar2 != 0) {
                source_local._7_1_ = true;
                goto LAB_0062b43b;
              }
            }
            source_local._7_1_ = false;
          }
          else {
            source_local._7_1_ = true;
          }
LAB_0062b43b:
          std::ifstream::~ifstream(&local_558);
          std::ifstream::~ifstream(&local_350);
        }
      }
      else {
        source_local._7_1_ = true;
      }
    }
    else {
      source_local._7_1_ = true;
    }
  }
  else {
    source_local._7_1_ = true;
  }
  return source_local._7_1_;
}

Assistant:

bool SystemTools::FilesDiffer(const std::string& source,
                              const std::string& destination)
{

#if defined(_WIN32)
  WIN32_FILE_ATTRIBUTE_DATA statSource;
  if (GetFileAttributesExW(Encoding::ToWindowsExtendedPath(source).c_str(),
                           GetFileExInfoStandard, &statSource) == 0) {
    return true;
  }

  WIN32_FILE_ATTRIBUTE_DATA statDestination;
  if (GetFileAttributesExW(
        Encoding::ToWindowsExtendedPath(destination).c_str(),
        GetFileExInfoStandard, &statDestination) == 0) {
    return true;
  }

  if (statSource.nFileSizeHigh != statDestination.nFileSizeHigh ||
      statSource.nFileSizeLow != statDestination.nFileSizeLow) {
    return true;
  }

  if (statSource.nFileSizeHigh == 0 && statSource.nFileSizeLow == 0) {
    return false;
  }
  off_t nleft =
    ((__int64)statSource.nFileSizeHigh << 32) + statSource.nFileSizeLow;

#else

  struct stat statSource;
  if (stat(source.c_str(), &statSource) != 0) {
    return true;
  }

  struct stat statDestination;
  if (stat(destination.c_str(), &statDestination) != 0) {
    return true;
  }

  if (statSource.st_size != statDestination.st_size) {
    return true;
  }

  if (statSource.st_size == 0) {
    return false;
  }
  off_t nleft = statSource.st_size;
#endif

#if defined(_WIN32)
  kwsys::ifstream finSource(source.c_str(), (std::ios::binary | std::ios::in));
  kwsys::ifstream finDestination(destination.c_str(),
                                 (std::ios::binary | std::ios::in));
#else
  kwsys::ifstream finSource(source.c_str());
  kwsys::ifstream finDestination(destination.c_str());
#endif
  if (!finSource || !finDestination) {
    return true;
  }

  // Compare the files a block at a time.
  char source_buf[KWSYS_ST_BUFFER];
  char dest_buf[KWSYS_ST_BUFFER];
  while (nleft > 0) {
    // Read a block from each file.
    std::streamsize nnext = (nleft > KWSYS_ST_BUFFER)
      ? KWSYS_ST_BUFFER
      : static_cast<std::streamsize>(nleft);
    finSource.read(source_buf, nnext);
    finDestination.read(dest_buf, nnext);

    // If either failed to read assume they are different.
    if (static_cast<std::streamsize>(finSource.gcount()) != nnext ||
        static_cast<std::streamsize>(finDestination.gcount()) != nnext) {
      return true;
    }

    // If this block differs the file differs.
    if (memcmp(static_cast<const void*>(source_buf),
               static_cast<const void*>(dest_buf),
               static_cast<size_t>(nnext)) != 0) {
      return true;
    }

    // Update the byte count remaining.
    nleft -= nnext;
  }

  // No differences found.
  return false;
}